

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_set_xo_var(secp256k1_ge *r,secp256k1_fe *x,int odd)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  secp256k1_fe *in_RSI;
  void *in_RDI;
  int ret;
  secp256k1_fe x3;
  secp256k1_fe x2;
  secp256k1_fe *in_stack_00000168;
  secp256k1_fe *in_stack_00000170;
  secp256k1_fe *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  secp256k1_fe local_68 [2];
  int local_14;
  secp256k1_fe *local_10;
  void *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  secp256k1_fe_verify(in_RSI);
  memcpy(local_8,local_10,0x28);
  secp256k1_fe_impl_sqr
            ((secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  secp256k1_fe_impl_mul
            ((secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88,(secp256k1_fe *)0x477423);
  *(undefined4 *)((long)local_8 + 0x50) = 0;
  secp256k1_fe_impl_add_int(local_68,7);
  iVar1 = secp256k1_fe_sqrt(in_stack_00000170,in_stack_00000168);
  secp256k1_fe_impl_normalize_var((secp256k1_fe *)((long)local_8 + 0x28));
  iVar2 = secp256k1_fe_impl_is_odd((secp256k1_fe *)((long)local_8 + 0x28));
  if (iVar2 != local_14) {
    secp256k1_fe_impl_negate_unchecked
              ((secp256k1_fe *)((long)local_8 + 0x28),(secp256k1_fe *)((long)local_8 + 0x28),1);
  }
  secp256k1_ge_verify((secp256k1_ge *)0x4774a1);
  return iVar1;
}

Assistant:

static int secp256k1_ge_set_xo_var(secp256k1_ge *r, const secp256k1_fe *x, int odd) {
    secp256k1_fe x2, x3;
    int ret;
    SECP256K1_FE_VERIFY(x);

    r->x = *x;
    secp256k1_fe_sqr(&x2, x);
    secp256k1_fe_mul(&x3, x, &x2);
    r->infinity = 0;
    secp256k1_fe_add_int(&x3, SECP256K1_B);
    ret = secp256k1_fe_sqrt(&r->y, &x3);
    secp256k1_fe_normalize_var(&r->y);
    if (secp256k1_fe_is_odd(&r->y) != odd) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
    }

    SECP256K1_GE_VERIFY(r);
    return ret;
}